

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O1

QStringList * __thiscall
QFileSystemComboBoxCompleter::splitPath
          (QStringList *__return_storage_ptr__,QFileSystemComboBoxCompleter *this,QString *path)

{
  long lVar1;
  undefined8 extraout_RAX;
  QDir local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  QCompleter::model();
  lVar1 = QMetaObject::cast((QObject *)&QFileSystemModel::staticMetaObject);
  if (lVar1 != 0) {
    QFileSystemModel::rootPath();
    QDir::QDir(local_60,(QString *)&local_40);
    QDir::filePath((QString *)&local_58);
    QCompleter::splitPath((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QDir::~QDir(local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (lVar1 != 0) {
      return __return_storage_ptr__;
    }
  }
  splitPath();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDir::~QDir(local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

QStringList splitPath(const QString &path) const override {
        if (const auto model = qobject_cast<QFileSystemModel *>(QCompleter::model())) {
            return QCompleter::splitPath(QDir(model->rootPath()).filePath(path));
        }

        Q_UNREACHABLE();
    }